

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1531.c
# Opt level: O1

int test(char *URL)

{
  uint uVar1;
  int iVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  long lVar5;
  int *piVar6;
  fd_set *__exceptfds;
  fd_set *__writefds;
  fd_set *pfVar7;
  fd_set *__readfds;
  timeval *__timeout;
  uint uVar8;
  timeval tVar9;
  int maxfd;
  int still_running;
  long curl_timeo;
  timeval timeout;
  timeval wait;
  int msgs_left;
  fd_set fdexcep;
  fd_set fdwrite;
  int local_1f0;
  int local_1ec;
  ulong local_1e8;
  timeval local_1e0;
  undefined8 local_1d0;
  timeval local_1c8;
  fd_set local_1b8;
  fd_set local_138;
  fd_set local_b8;
  
  tv_test_start = tutil_tvnow();
  uVar1 = curl_global_init(3);
  uVar4 = _stderr;
  if (uVar1 == 0) {
    pfVar7 = (fd_set *)0x0;
  }
  else {
    pfVar7 = (fd_set *)(ulong)uVar1;
    uVar3 = curl_easy_strerror(uVar1);
    curl_mfprintf(uVar4,"%s:%d curl_global_init() failed, with code %d (%s)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib1531.c"
                  ,0x2c,uVar1,uVar3);
  }
  if ((int)pfVar7 == 0) {
    uVar4 = curl_easy_init();
    uVar3 = curl_multi_init();
    curl_multi_add_handle(uVar3,uVar4);
    curl_easy_setopt(uVar4,0x2712,URL);
    curl_easy_setopt(uVar4,0x75a8,8);
    local_1d0 = uVar4;
    curl_easy_setopt(uVar4,0x271f,".abc");
    curl_multi_perform(uVar3,&local_1ec);
    tVar9 = tutil_tvnow();
    lVar5 = tutil_tvdiff(tVar9,tv_test_start);
    if (lVar5 < 0xea61) {
      pfVar7 = &local_138;
      uVar1 = 0;
      do {
        local_1f0 = -1;
        local_1e8 = 0xffffffffffffffff;
        local_1b8.fds_bits[0] = 0;
        local_1b8.fds_bits[1] = 0;
        local_1b8.fds_bits[2] = 0;
        local_1b8.fds_bits[3] = 0;
        local_1b8.fds_bits[4] = 0;
        local_1b8.fds_bits[5] = 0;
        local_1b8.fds_bits[6] = 0;
        local_1b8.fds_bits[7] = 0;
        local_1b8.fds_bits[8] = 0;
        local_1b8.fds_bits[9] = 0;
        local_1b8.fds_bits[10] = 0;
        local_1b8.fds_bits[0xb] = 0;
        local_1b8.fds_bits[0xc] = 0;
        local_1b8.fds_bits[0xd] = 0;
        local_1b8.fds_bits[0xe] = 0;
        local_1b8.fds_bits[0xf] = 0;
        local_b8.fds_bits[0] = 0;
        local_b8.fds_bits[1] = 0;
        local_b8.fds_bits[2] = 0;
        local_b8.fds_bits[3] = 0;
        local_b8.fds_bits[4] = 0;
        local_b8.fds_bits[5] = 0;
        local_b8.fds_bits[6] = 0;
        local_b8.fds_bits[7] = 0;
        local_b8.fds_bits[8] = 0;
        local_b8.fds_bits[9] = 0;
        local_b8.fds_bits[10] = 0;
        local_b8.fds_bits[0xb] = 0;
        local_b8.fds_bits[0xc] = 0;
        local_b8.fds_bits[0xd] = 0;
        local_b8.fds_bits[0xe] = 0;
        local_b8.fds_bits[0xf] = 0;
        local_138.fds_bits[0xe] = 0;
        local_138.fds_bits[0xf] = 0;
        local_138.fds_bits[0xc] = 0;
        local_138.fds_bits[0xd] = 0;
        local_138.fds_bits[10] = 0;
        local_138.fds_bits[0xb] = 0;
        local_138.fds_bits[8] = 0;
        local_138.fds_bits[9] = 0;
        local_138.fds_bits[6] = 0;
        local_138.fds_bits[7] = 0;
        local_138.fds_bits[4] = 0;
        local_138.fds_bits[5] = 0;
        local_138.fds_bits[2] = 0;
        local_138.fds_bits[3] = 0;
        local_138.fds_bits[0] = 0;
        local_138.fds_bits[1] = 0;
        local_1e0.tv_sec = 1;
        local_1e0.tv_usec = 0;
        curl_multi_timeout(uVar3,&local_1e8);
        if (-1 < (long)local_1e8) {
          local_1e0.tv_sec = local_1e8 / 1000;
          if (local_1e8 < 2000) {
            local_1e0.tv_usec = (local_1e8 % 1000) * 1000;
          }
          else {
            local_1e0.tv_sec = 1;
          }
        }
        iVar2 = curl_multi_fdset(uVar3,&local_1b8,&local_b8,pfVar7,&local_1f0);
        if (iVar2 == 0) {
          if (local_1f0 == -1) {
            local_1c8.tv_sec = 0;
            local_1c8.tv_usec = 100000;
            iVar2 = 0;
            __readfds = (fd_set *)0x0;
            __writefds = (fd_set *)0x0;
            __exceptfds = (fd_set *)0x0;
            __timeout = &local_1c8;
          }
          else {
            iVar2 = local_1f0 + 1;
            __timeout = &local_1e0;
            __exceptfds = pfVar7;
            __writefds = &local_b8;
            __readfds = &local_1b8;
          }
          iVar2 = select(iVar2,__readfds,__writefds,__exceptfds,__timeout);
          if (iVar2 != -1) {
            curl_multi_perform(uVar3,&local_1ec);
          }
          tVar9 = tutil_tvnow();
          lVar5 = tutil_tvdiff(tVar9,tv_test_start);
          if (60000 < lVar5) {
            curl_mfprintf(_stderr,
                          "%s:%d ABORTING TEST, since it seems that it would have run forever.\n",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib1531.c"
                          ,0x87);
            uVar1 = 0x7d;
          }
          iVar2 = 0xc;
          if (uVar1 == 0) {
            iVar2 = 0;
          }
        }
        else {
          curl_mfprintf(_stderr,"curl_multi_fdset() failed, code %d.\n",iVar2);
          iVar2 = 0xd;
        }
        if (iVar2 != 0) {
          if (iVar2 == 0xc) goto LAB_0010269e;
          if (iVar2 != 0xd) goto LAB_001026b8;
          break;
        }
      } while (local_1ec != 0);
LAB_00102614:
      piVar6 = (int *)curl_multi_info_read(uVar3,&local_1b8);
      if ((piVar6 == (int *)0x0) || (*piVar6 != 1)) goto LAB_0010262c;
      curl_mprintf("HTTP transfer completed with status %d\n",piVar6[4]);
LAB_0010269e:
      pfVar7 = (fd_set *)(ulong)uVar1;
      goto LAB_001026a1;
    }
    curl_mfprintf(_stderr,"%s:%d ABORTING TEST, since it seems that it would have run forever.\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib1531.c"
                  ,0x40);
    pfVar7 = (fd_set *)0x7d;
LAB_001026a1:
    curl_multi_cleanup(uVar3);
    curl_easy_cleanup(local_1d0);
    curl_global_cleanup();
  }
LAB_001026b8:
  return (int)pfVar7;
LAB_0010262c:
  tVar9 = tutil_tvnow();
  lVar5 = tutil_tvdiff(tVar9,tv_test_start);
  uVar8 = uVar1;
  if (60000 < lVar5) {
    curl_mfprintf(_stderr,"%s:%d ABORTING TEST, since it seems that it would have run forever.\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib1531.c"
                  ,0x92);
    uVar8 = 0x7d;
  }
  pfVar7 = (fd_set *)(ulong)uVar8;
  if ((piVar6 == (int *)0x0) || (uVar1 = 0, uVar8 != 0)) goto LAB_001026a1;
  goto LAB_00102614;
}

Assistant:

int test(char *URL)
{
  CURL *easy;
  CURLM *multi_handle;
  int still_running; /* keep number of running handles */
  CURLMsg *msg; /* for picking up messages with the transfer status */
  int msgs_left; /* how many messages are left */
  int res = CURLE_OK;

  start_test_timing();

  global_init(CURL_GLOBAL_ALL);

  /* Allocate one CURL handle per transfer */
  easy = curl_easy_init();

  /* init a multi stack */
  multi_handle = curl_multi_init();

  /* add the individual transfer */
  curl_multi_add_handle(multi_handle, easy);

  /* set the options (I left out a few, you'll get the point anyway) */
  curl_easy_setopt(easy, CURLOPT_URL, URL);
  curl_easy_setopt(easy, CURLOPT_POSTFIELDSIZE_LARGE,
                   (curl_off_t)testDataSize);
  curl_easy_setopt(easy, CURLOPT_POSTFIELDS, testData);

  /* we start some action by calling perform right away */
  curl_multi_perform(multi_handle, &still_running);

  abort_on_test_timeout();

  do {
    struct timeval timeout;
    int rc; /* select() return code */
    CURLMcode mc; /* curl_multi_fdset() return code */

    fd_set fdread;
    fd_set fdwrite;
    fd_set fdexcep;
    int maxfd = -1;

    long curl_timeo = -1;

    FD_ZERO(&fdread);
    FD_ZERO(&fdwrite);
    FD_ZERO(&fdexcep);

    /* set a suitable timeout to play around with */
    timeout.tv_sec = 1;
    timeout.tv_usec = 0;

    curl_multi_timeout(multi_handle, &curl_timeo);
    if(curl_timeo >= 0) {
      timeout.tv_sec = curl_timeo / 1000;
      if(timeout.tv_sec > 1)
        timeout.tv_sec = 1;
      else
        timeout.tv_usec = (curl_timeo % 1000) * 1000;
    }

    /* get file descriptors from the transfers */
    mc = curl_multi_fdset(multi_handle, &fdread, &fdwrite, &fdexcep, &maxfd);

    if(mc != CURLM_OK) {
      fprintf(stderr, "curl_multi_fdset() failed, code %d.\n", mc);
      break;
    }

    /* On success the value of maxfd is guaranteed to be >= -1. We call
       select(maxfd + 1, ...); specially in case of (maxfd == -1) there are
       no fds ready yet so we call select(0, ...) --or Sleep() on Windows--
       to sleep 100ms, which is the minimum suggested value in the
       curl_multi_fdset() doc. */

    if(maxfd == -1) {
#ifdef _WIN32
      Sleep(100);
      rc = 0;
#else
      /* Portable sleep for platforms other than Windows. */
      struct timeval wait = { 0, 100 * 1000 }; /* 100ms */
      rc = select(0, NULL, NULL, NULL, &wait);
#endif
    }
    else {
      /* Note that on some platforms 'timeout' may be modified by select().
         If you need access to the original value save a copy beforehand. */
      rc = select(maxfd + 1, &fdread, &fdwrite, &fdexcep, &timeout);
    }

    switch(rc) {
    case -1:
      /* select error */
      break;
    case 0: /* timeout */
    default: /* action */
      curl_multi_perform(multi_handle, &still_running);
      break;
    }

    abort_on_test_timeout();
  } while(still_running);

  /* See how the transfers went */
  do {
    msg = curl_multi_info_read(multi_handle, &msgs_left);
    if(msg && msg->msg == CURLMSG_DONE) {
      printf("HTTP transfer completed with status %d\n", msg->data.result);
      break;
    }

    abort_on_test_timeout();
  } while(msg);

test_cleanup:
  curl_multi_cleanup(multi_handle);

  /* Free the CURL handles */
  curl_easy_cleanup(easy);
  curl_global_cleanup();

  return res;
}